

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckLowerCaseAttrValue(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  Lexer *pLVar2;
  Bool BVar3;
  tmbstr ptVar4;
  char *pcVar5;
  
  pcVar5 = attval->value;
  if (pcVar5 != (char *)0x0) {
    cVar1 = *pcVar5;
    while (cVar1 != '\0') {
      pcVar5 = pcVar5 + 1;
      BVar3 = prvTidyIsUpper((int)cVar1);
      if (BVar3 != no) {
        pLVar2 = doc->lexer;
        if (pLVar2->isvoyager != no) {
          prvTidyReportAttrError(doc,node,attval,0x111);
        }
        if ((pLVar2->isvoyager == no) && (*(int *)((doc->config).value + 0x42) == 0)) {
          return;
        }
        ptVar4 = prvTidytmbstrtolower(attval->value);
        attval->value = ptVar4;
        return;
      }
      cVar1 = *pcVar5;
    }
  }
  return;
}

Assistant:

static void CheckLowerCaseAttrValue( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    Bool hasUpper = no;
    
    if (!AttrHasValue(attval))
        return;

    p = attval->value;
    
    while (*p)
    {
        if (TY_(IsUpper)(*p)) /* #501230 - fix by Terry Teague - 09 Jan 02 */
        {
            hasUpper = yes;
            break;
        }
        p++;
    }

    if (hasUpper)
    {
        Lexer* lexer = doc->lexer;
        if (lexer->isvoyager)
            TY_(ReportAttrError)( doc, node, attval, ATTR_VALUE_NOT_LCASE);
  
        if ( lexer->isvoyager || cfgBool(doc, TidyLowerLiterals) )
            attval->value = TY_(tmbstrtolower)(attval->value);
    }
}